

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O1

uint borg_guess_race(uint8_t a,wchar_t c,_Bool multi,wchar_t y,wchar_t x)

{
  chunk_conflict *c_00;
  uint uVar1;
  loc grid;
  monster *pmVar2;
  undefined7 in_register_00000039;
  
  c_00 = cave;
  grid = (loc)loc(c,(int)CONCAT71(in_register_00000039,a));
  pmVar2 = square_monster(c_00,grid);
  if (pmVar2 == (monster *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = pmVar2->race->ridx;
  }
  return uVar1;
}

Assistant:

static unsigned int borg_guess_race(
    uint8_t a, wchar_t c, bool multi, int y, int x)
{
    /*  ok, this is an real cheat.  he ought to use the look command
     * in order to correctly id the monster.  but i am passing that up for
     * the sake of speed
     */
    struct monster *m_ptr;
    m_ptr = square_monster(cave, loc(x, y));

    if (!m_ptr)
        return 0;

    /* Actual monsters */
    return (m_ptr->race->ridx);
}